

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O2

void check_unpaid_usage(obj *otmp,boolean altusage)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  monst *mtmp;
  ulong amount;
  char *pcVar4;
  char *pcVar5;
  char *line;
  char *pcVar6;
  ulong uStack_40;
  
  if ((u.ushops[0] != '\0' & (byte)otmp->field_0x4a >> 2) != 1) {
    return;
  }
  if ((otmp->spe < '\x01') && ((objects[otmp->otyp].field_0x10 & 0x20) != 0)) {
    return;
  }
  mtmp = shop_keeper(level,u.ushops[0]);
  if (mtmp == (monst *)0x0) {
    return;
  }
  iVar2 = inhishop(mtmp);
  if (iVar2 == 0) {
    return;
  }
  iVar2 = inhishop(mtmp);
  if (iVar2 == 0) {
    return;
  }
  amount = get_cost(otmp,mtmp);
  uVar1 = otmp->otyp;
  switch(uVar1) {
  case 0xe1:
    break;
  case 0xe2:
  case 0xe3:
  case 0xe4:
  case 0xe5:
  case 0xe6:
  case 0xea:
  case 0xeb:
switchD_00231f6b_caseD_e2:
    if ((ushort)(uVar1 - 0xfd) < 0xb) goto switchD_00231f6b_caseD_e7;
    if (otmp->oclass == '\n') {
      amount = amount - amount / 5;
      goto LAB_00232026;
    }
    if (otmp->oclass == '\v') goto switchD_00231f6b_caseD_e7;
    if ((0xb < uVar1 - 0xea) || ((0xa01U >> (uVar1 - 0xea & 0x1f) & 1) == 0)) {
      if (uVar1 == 0x142) break;
      goto LAB_0023202b;
    }
    uStack_40 = 10;
    goto LAB_00231f93;
  case 0xe7:
  case 0xe8:
  case 0xec:
switchD_00231f6b_caseD_e7:
    if ('\x01' < otmp->spe) {
      amount = amount >> 2;
      goto LAB_00232026;
    }
    goto LAB_0023202b;
  case 0xe9:
    if (altusage == '\0') {
      amount = (ulong)objects[0xe8].oc_cost;
      goto LAB_00232026;
    }
    amount = amount + amount / 3;
    if (otmp->oclass != '\n') goto LAB_00232090;
    goto LAB_00232032;
  default:
    if (uVar1 == 0xf7) {
      amount = amount >> 1;
      goto LAB_00232026;
    }
    if (uVar1 != 0x101) goto switchD_00231f6b_caseD_e2;
  }
  uStack_40 = 5;
LAB_00231f93:
  amount = amount / uStack_40;
LAB_00232026:
  if (amount == 0) {
    return;
  }
LAB_0023202b:
  if (otmp->oclass == '\n') {
LAB_00232032:
    uVar3 = mt_random();
    pcVar6 = "This is no free library, cad!  ";
    if ((uVar3 & 1) == 0) {
      pcVar6 = "";
    }
    pcVar5 = " an additional";
    if (*(int *)&mtmp[0x1b].field_0x60 < 1) {
      pcVar5 = "";
    }
    line = "%sYou owe%s %ld %s.";
  }
  else if (uVar1 == 0x142) {
    line = "%s%sThat will cost you %ld %s (Yendorian Fuel Tax).";
    pcVar6 = "";
    pcVar5 = "";
  }
  else {
LAB_00232090:
    uVar3 = mt_random();
    pcVar6 = "Hey!  ";
    if (uVar3 % 3 != 0) {
      pcVar6 = "";
    }
    uVar3 = mt_random();
    pcVar5 = "Ahem.  ";
    if (uVar3 % 3 != 0) {
      pcVar5 = "";
    }
    line = "%s%sUsage fee, %ld %s.";
  }
  if ((*(uint *)&mtmp->field_0x60 & 0xc0000) != 0x80000) {
    pcVar4 = currency(amount);
    verbalize(line,pcVar6,pcVar5,amount,pcVar4);
  }
  *(int *)&mtmp[0x1b].field_0x60 = *(int *)&mtmp[0x1b].field_0x60 + (int)amount;
  exercise(2,'\x01');
  return;
}

Assistant:

void check_unpaid_usage(struct obj *otmp, boolean altusage)
{
	struct monst *shkp;
	const char *fmt, *arg1, *arg2;
	long tmp;

	if (!otmp->unpaid || !*u.ushops ||
		(otmp->spe <= 0 && objects[otmp->otyp].oc_charged))
	    return;
	if (!(shkp = shop_keeper(level, *u.ushops)) || !inhishop(shkp))
	    return;
	if ((tmp = cost_per_charge(shkp, otmp, altusage)) == 0L)
	    return;

	arg1 = arg2 = "";
	if (otmp->oclass == SPBOOK_CLASS) {
	    fmt = "%sYou owe%s %ld %s.";
	    arg1 = rn2(2) ? "This is no free library, cad!  " : "";
	    arg2 = ESHK(shkp)->debit > 0L ? " an additional" : "";
	} else if (otmp->otyp == POT_OIL) {
	    fmt = "%s%sThat will cost you %ld %s (Yendorian Fuel Tax).";
	} else {
	    fmt = "%s%sUsage fee, %ld %s.";
	    if (!rn2(3)) arg1 = "Hey!  ";
	    if (!rn2(3)) arg2 = "Ahem.  ";
	}

	if (shkp->mcanmove || !shkp->msleeping)
	    verbalize(fmt, arg1, arg2, tmp, currency(tmp));
	ESHK(shkp)->debit += tmp;
	exercise(A_WIS, TRUE);		/* you just got info */
}